

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * wasm::operator<<(ostream *os,Tuple *tuple)

{
  ostream *poVar1;
  TypePrinter local_98;
  
  anon_unknown_0::TypePrinter::TypePrinter(&local_98,os);
  poVar1 = anon_unknown_0::TypePrinter::print(&local_98,tuple);
  anon_unknown_0::TypePrinter::~TypePrinter(&local_98);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Tuple tuple) {
  return TypePrinter(os).print(tuple);
}